

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O2

void __thiscall wasm::extract(wasm *this,PassRunner *runner,Module *module,Name name)

{
  pointer puVar1;
  long lVar2;
  undefined8 this_00;
  ostream *poVar3;
  Pass *pPVar4;
  PassRunner *pPVar5;
  PassRunner *pPVar6;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar7;
  bool bVar8;
  Name name_00;
  undefined1 auStack_238 [8];
  PassRunner postRunner;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  Module *local_88;
  PassRunner *local_80;
  string local_78;
  undefined1 local_54 [20];
  PassRunner *local_40;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_38;
  
  pPVar5 = name.super_IString.str._M_len;
  pPVar6 = pPVar5;
  local_40 = (PassRunner *)this;
  poVar3 = std::operator<<((ostream *)&std::cerr,"extracting ");
  name_00.super_IString.str._M_str = (char *)pPVar6;
  name_00.super_IString.str._M_len = (size_t)pPVar5;
  local_54._12_8_ = module;
  poVar3 = operator<<((wasm *)poVar3,(ostream *)module,name_00);
  std::operator<<(poVar3,"\n");
  puVar1 = (runner->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = false;
  local_54._4_8_ = runner;
  for (puVar7 = (runner->passes).
                super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this_00 = local_54._4_8_,
      puVar7 != puVar1; puVar7 = puVar7 + 1) {
    if (((puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
         super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->runner == pPVar5) {
      bVar8 = true;
    }
    else {
      Name::Name((Name *)auStack_238,"env");
      pPVar4 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      (pPVar4->name)._M_string_length = (size_type)auStack_238;
      (pPVar4->name).field_2._M_allocated_capacity = (size_type)postRunner._vptr_PassRunner;
      pPVar4 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      pPVar6 = pPVar4->runner;
      *(_func_int ***)((long)&(pPVar4->name).field_2 + 8) = pPVar4->_vptr_Pass;
      *(PassRunner **)
       &(pPVar4->passArg).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload = pPVar6;
      pPVar4 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      lVar2 = *(long *)((long)&(pPVar4->passArg).
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       + 0x18);
      if (*(long *)((long)&(pPVar4->passArg).
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   + 0x20) != lVar2) {
        *(long *)((long)&(pPVar4->passArg).
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 + 0x20) = lVar2;
        pPVar4 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      }
      pPVar4[1].runner = (PassRunner *)0x0;
    }
  }
  if (bVar8) {
    std::
    vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ::clear((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             *)local_54._4_8_);
    Module::updateMaps((Module *)this_00);
    auStack_238 = (undefined1  [8])local_54._12_8_;
    postRunner.wasm._0_1_ = 0;
    local_88 = (Module *)local_54._12_8_;
    local_54._0_4_ = 0;
    postRunner._vptr_PassRunner = (_func_int **)pPVar5;
    local_80 = pPVar5;
    std::
    make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
              ((Name *)&local_38,(ExternalKind *)&local_88,
               (variant<wasm::Name,_wasm::HeapType> *)local_54);
    Module::addExport((Module *)this_00,&local_38);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_38);
    PassRunner::PassRunner((PassRunner *)auStack_238,local_40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"remove-unused-module-elements",(allocator<char> *)&local_88);
    local_b0._M_engaged = false;
    PassRunner::add((PassRunner *)auStack_238,&local_78,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_b0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_b0);
    std::__cxx11::string::~string((string *)&local_78);
    PassRunner::run((PassRunner *)auStack_238);
    PassRunner::~PassRunner((PassRunner *)auStack_238);
    return;
  }
  Fatal::Fatal((Fatal *)auStack_238);
  Fatal::operator<<((Fatal *)auStack_238,(char (*) [40])"could not find the function to extract\n");
  Fatal::~Fatal((Fatal *)auStack_238);
}

Assistant:

static void extract(PassRunner* runner, Module* module, Name name) {
  std::cerr << "extracting " << name << "\n";
  bool found = false;
  for (auto& func : module->functions) {
    if (func->name != name) {
      // Turn it into an import.
      func->module = "env";
      func->base = func->name;
      func->vars.clear();
      func->body = nullptr;
    } else {
      found = true;
    }
  }
  if (!found) {
    Fatal() << "could not find the function to extract\n";
  }

  // Leave just one export, for the thing we want.
  module->exports.clear();
  module->updateMaps();
  module->addExport(Builder::makeExport(name, name, ExternalKind::Function));

  // Remove unneeded things.
  PassRunner postRunner(runner);
  postRunner.add("remove-unused-module-elements");
  postRunner.run();
}